

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testConstList(void)

{
  ListLink *link_1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ListLink *link;
  Point2d *p_1;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[2] = 0x140000000a;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[2] = 0x280000001e;
  *puVar2 = 0;
  puVar2[1] = puVar1;
  *puVar1 = puVar2;
  *(undefined4 *)(puVar1 + 2) = 0;
  do {
    puVar2 = (undefined8 *)*puVar1;
    operator_delete(puVar1);
    puVar1 = puVar2;
  } while (puVar2 != (undefined8 *)0x0);
  return;
}

Assistant:

void
testConstList() {
	sl::List<Point2d> list;

	Point2d* point = new Point2d;
	point->m_x = 10;
	point->m_y = 20;
	list.insertTail(point);

	point = new Point2d;
	point->m_x = 30;
	point->m_y = 40;
	list.insertTail(point);

	sl::Iterator<Point2d> it = list.getHead();
	sl::ConstIterator<Point2d> it2 = it;
	it2 = it;
	it2++;

	it2 = it.getInc(1);

	int x = it->m_x;
	int y = it2->m_y;

	it->m_x = 0;

//	it->m_x = 10;
//	it->m_y = 20;
}